

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.h
# Opt level: O1

void __thiscall TPZFBMatrix<int>::TPZFBMatrix(TPZFBMatrix<int> *this,TPZFBMatrix<int> *param_1)

{
  ulong uVar1;
  int *piVar2;
  int64_t iVar3;
  char cVar4;
  int *piVar5;
  ulong uVar6;
  
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_0188ccb0;
  iVar3 = (param_1->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow =
       (param_1->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol = iVar3;
  cVar4 = (param_1->super_TPZMatrix<int>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.fDecomposed =
       (param_1->super_TPZMatrix<int>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.fDefPositive = cVar4;
  (this->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFBMatrix_0188af40;
  TPZVec<int>::TPZVec(&this->fElem,&param_1->fElem);
  iVar3 = param_1->fBandUpper;
  this->fBandLower = param_1->fBandLower;
  this->fBandUpper = iVar3;
  (this->fPivot).super_TPZVec<int>.fStore = (int *)0x0;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  uVar1 = (param_1->fPivot).super_TPZVec<int>.fNElements;
  if ((long)uVar1 < 6) {
    piVar5 = (this->fPivot).fExtAlloc;
    uVar6 = 0;
  }
  else {
    piVar5 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    uVar6 = uVar1;
  }
  (this->fPivot).super_TPZVec<int>.fStore = piVar5;
  (this->fPivot).super_TPZVec<int>.fNElements = uVar1;
  (this->fPivot).super_TPZVec<int>.fNAlloc = uVar6;
  if (0 < (long)uVar1) {
    piVar5 = (param_1->fPivot).super_TPZVec<int>.fStore;
    piVar2 = (this->fPivot).super_TPZVec<int>.fStore;
    uVar6 = 0;
    do {
      piVar2[uVar6] = piVar5[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return;
}

Assistant:

TPZFBMatrix (const TPZFBMatrix<TVar> & ) = default;